

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O2

Poll * __thiscall Poll::subscribe_alarm(Poll *this,shared_ptr<Alarm> *alarm)

{
  __shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2> *this_00;
  uint64_t local_20;
  
  local_20 = Alarm::get_timeout_time
                       ((alarm->super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this_00 = &std::
             map<unsigned_long,_std::shared_ptr<Alarm>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>_>
             ::operator[](&this->alarms,&local_20)->
             super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&alarm->super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>);
  return this;
}

Assistant:

Poll &Poll::subscribe_alarm(std::shared_ptr<Alarm> alarm) {
  this->alarms[alarm->get_timeout_time()] = alarm;
  return *this;
}